

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

AActor * P_BlockmapSearch(AActor *mo,int distance,_func_AActor_ptr_AActor_ptr_int_void_ptr *check,
                         void *params)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AActor *pAVar8;
  double dVar9;
  AActor *target;
  int count;
  int finalStop;
  int thirdStop;
  int secondStop;
  int firstStop;
  int blockIndex;
  int startY;
  int startX;
  int blockY;
  int blockX;
  void *params_local;
  _func_AActor_ptr_AActor_ptr_int_void_ptr *check_local;
  int distance_local;
  AActor *mo_local;
  
  dVar9 = AActor::X(mo);
  iVar1 = GetBlockX(dVar9);
  dVar9 = AActor::Y(mo);
  iVar2 = GetBlockY(dVar9);
  validcount = validcount + 1;
  if ((((iVar1 < 0) || (bmapwidth <= iVar1)) || (iVar2 < 0)) ||
     ((bmapheight <= iVar2 ||
      (mo_local = (*check)(mo,iVar2 * bmapwidth + iVar1,params), mo_local == (AActor *)0x0)))) {
    for (target._0_4_ = 1; (int)target <= distance; target._0_4_ = (int)target + 1) {
      iVar3 = clamp<int>(iVar1 - (int)target,0,bmapwidth + -1);
      iVar4 = clamp<int>(iVar2 - (int)target,0,bmapheight + -1);
      iVar5 = iVar4 * bmapwidth + iVar3;
      thirdStop = iVar1 + (int)target;
      if (-1 < thirdStop) {
        if (bmapwidth <= thirdStop) {
          thirdStop = bmapwidth + -1;
        }
        finalStop = iVar2 + (int)target;
        if (-1 < finalStop) {
          if (bmapheight <= finalStop) {
            finalStop = bmapheight + -1;
          }
          iVar6 = finalStop * bmapwidth;
          iVar7 = finalStop * bmapwidth;
          iVar4 = iVar4 * bmapwidth;
          for (secondStop = iVar5; secondStop <= iVar4 + thirdStop; secondStop = secondStop + 1) {
            pAVar8 = (*check)(mo,secondStop,params);
            if (pAVar8 != (AActor *)0x0) {
              return pAVar8;
            }
          }
          for (secondStop = secondStop + -1; secondStop <= iVar7 + thirdStop;
              secondStop = bmapwidth + secondStop) {
            pAVar8 = (*check)(mo,secondStop,params);
            if (pAVar8 != (AActor *)0x0) {
              return pAVar8;
            }
          }
          for (secondStop = secondStop - bmapwidth; iVar6 + iVar3 <= secondStop;
              secondStop = secondStop + -1) {
            pAVar8 = (*check)(mo,secondStop,params);
            if (pAVar8 != (AActor *)0x0) {
              return pAVar8;
            }
          }
          for (secondStop = secondStop + 1; iVar5 < secondStop; secondStop = secondStop - bmapwidth)
          {
            pAVar8 = (*check)(mo,secondStop,params);
            if (pAVar8 != (AActor *)0x0) {
              return pAVar8;
            }
          }
        }
      }
    }
    mo_local = (AActor *)0x0;
  }
  return mo_local;
}

Assistant:

AActor *P_BlockmapSearch (AActor *mo, int distance, AActor *(*check)(AActor*, int, void *), void *params)
{
	int blockX;
	int blockY;
	int startX, startY;
	int blockIndex;
	int firstStop;
	int secondStop;
	int thirdStop;
	int finalStop;
	int count;
	AActor *target;

	startX = GetBlockX(mo->X());
	startY = GetBlockY(mo->Y());
	validcount++;
	
	if (startX >= 0 && startX < bmapwidth && startY >= 0 && startY < bmapheight)
	{
		if ( (target = check (mo, startY*bmapwidth+startX, params)) )
		{ // found a target right away
			return target;
		}
	}
	for (count = 1; count <= distance; count++)
	{
		blockX = clamp (startX-count, 0, bmapwidth-1);
		blockY = clamp (startY-count, 0, bmapheight-1);

		blockIndex = blockY*bmapwidth+blockX;
		firstStop = startX+count;
		if (firstStop < 0)
		{
			continue;
		}
		if (firstStop >= bmapwidth)
		{
			firstStop = bmapwidth-1;
		}
		secondStop = startY+count;
		if (secondStop < 0)
		{
			continue;
		}
		if (secondStop >= bmapheight)
		{
			secondStop = bmapheight-1;
		}
		thirdStop = secondStop*bmapwidth+blockX;
		secondStop = secondStop*bmapwidth+firstStop;
		firstStop += blockY*bmapwidth;
		finalStop = blockIndex;		

		// Trace the first block section (along the top)
		for (; blockIndex <= firstStop; blockIndex++)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the second block section (right edge)
		for (blockIndex--; blockIndex <= secondStop; blockIndex += bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}		
		// Trace the third block section (bottom edge)
		for (blockIndex -= bmapwidth; blockIndex >= thirdStop; blockIndex--)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the final block section (left edge)
		for (blockIndex++; blockIndex > finalStop; blockIndex -= bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
	}
	return NULL;	
}